

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O3

SymbolEntryMap * __thiscall
bhf::ads::SymbolAccess::FetchSymbolEntries_abi_cxx11_
          (SymbolEntryMap *__return_storage_ptr__,SymbolAccess *this)

{
  undefined4 uVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  long lVar4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>
  _Var5;
  ostream *poVar6;
  AdsException *pAVar7;
  size_t lengthLimit;
  ulong uVar8;
  int iVar9;
  SymbolEntry *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_bool>
  pVar10;
  uint32_t bytesRead;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  *entries;
  SymbolEntry next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> symbols;
  stringstream stream;
  _Rb_tree_color local_26c;
  int local_268;
  uint local_264;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
  *local_260;
  string local_258;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [6];
  _Alloc_hider local_178;
  char local_168 [16];
  _Alloc_hider local_158;
  char local_148 [16];
  _Alloc_hider local_138;
  char local_128 [248];
  
  local_26c = _S_red;
  local_260 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
               *)__return_storage_ptr__;
  lVar4 = AdsDevice::ReadReqEx2(&this->device,0xf00c,0,8,&local_268,&local_26c);
  if (lVar4 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar6 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FetchSymbolEntries",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"(): Reading symbol info failed with: 0x",0x27);
    *(uint *)(local_1b8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 0x28) =
         *(uint *)(local_1b8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 0x28) &
         0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    local_258._M_dataplus._M_p._0_4_ = CONCAT31(local_258._M_dataplus._M_p._1_3_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_258,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_258._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_258._M_dataplus._M_p) !=
        &local_258.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_258._M_dataplus._M_p._4_4_,
                               (_Rb_tree_color)local_258._M_dataplus._M_p));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)&local_138);
    pAVar7 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar7,lVar4);
    __cxa_throw(pAVar7,&AdsException::typeinfo,AdsException::~AdsException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_1d0,(ulong)local_264,(allocator_type *)local_1b8);
  lVar4 = AdsDevice::ReadReqEx2
                    (&this->device,0xf00b,0,(ulong)local_264,
                     local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_26c);
  if (lVar4 == 0) {
    *(undefined8 *)local_260 = 0;
    *(undefined8 *)(local_260 + 8) = 0;
    lengthLimit = 0;
    *(_Base_ptr *)(local_260 + 0x10) = (_Base_ptr)0x0;
    *(_Base_ptr *)(local_260 + 0x18) = (_Base_ptr)(local_260 + 8);
    *(_Base_ptr *)(local_260 + 0x20) = (_Base_ptr)(local_260 + 8);
    *(size_t *)(local_260 + 0x28) = 0;
    iVar9 = local_268 + 1;
    this_00 = (SymbolEntry *)
              local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar9 = iVar9 + -1;
      if (iVar9 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar6 = (ostream *)(local_1b8 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FetchSymbolEntries",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): nSymbols: ",0xe);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," nSymSize:",10);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
        std::__cxx11::stringbuf::str();
        Logger::Log(3,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_258._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_258._M_dataplus._M_p)
            != &local_258.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                   (_Rb_tree_color)local_258._M_dataplus._M_p));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)&local_138);
        pAVar7 = (AdsException *)__cxa_allocate_exception(0x30);
        AdsException::AdsException(pAVar7,0x706);
        __cxa_throw(pAVar7,&AdsException::typeinfo,AdsException::~AdsException);
      }
      SymbolEntry::Parse_abi_cxx11_
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
                  *)local_1b8,this_00,(uint8_t *)(ulong)local_26c,lengthLimit);
      pVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
               ::_M_emplace_unique<std::pair<std::__cxx11::string,bhf::ads::SymbolEntry>>
                         (local_260,
                          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
                           *)local_1b8);
      _Var5 = pVar10.first._M_node;
      local_258._M_dataplus._M_p._0_4_ = _Var5._M_node[2]._M_color;
      local_258._M_dataplus._M_p._4_4_ = *(undefined4 *)&_Var5._M_node[2].field_0x4;
      local_258._M_string_length._0_4_ = *(undefined4 *)&_Var5._M_node[2]._M_parent;
      uVar1 = *(undefined4 *)((long)&_Var5._M_node[2]._M_parent + 4);
      local_258.field_2._M_allocated_capacity._2_4_ =
           *(undefined4 *)((long)&_Var5._M_node[2]._M_left + 2);
      local_258.field_2._6_4_ = *(undefined4 *)((long)&_Var5._M_node[2]._M_left + 6);
      local_258.field_2._10_4_ = *(undefined4 *)((long)&_Var5._M_node[2]._M_right + 2);
      local_258.field_2._M_allocated_capacity._0_2_ =
           (undefined2)((uint)*(undefined4 *)((long)&_Var5._M_node[2]._M_parent + 6) >> 0x10);
      local_258._M_string_length._4_2_ = (undefined2)uVar1;
      local_258._M_string_length._6_2_ = (undefined2)((uint)uVar1 >> 0x10);
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,*(long *)(_Var5._M_node + 3),
                 (long)&(_Var5._M_node[3]._M_parent)->_M_color + *(long *)(_Var5._M_node + 3));
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,*(long *)(_Var5._M_node + 4),
                 (long)&(_Var5._M_node[4]._M_parent)->_M_color + *(long *)(_Var5._M_node + 4));
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,*(long *)(_Var5._M_node + 5),
                 (long)&(_Var5._M_node[5]._M_parent)->_M_color + *(long *)(_Var5._M_node + 5));
      if (local_138._M_p != local_128) {
        operator_delete(local_138._M_p);
      }
      if (local_158._M_p != local_1b8 + 0x70) {
        operator_delete(local_158._M_p);
      }
      if (local_178._M_p != local_1b8 + 0x50) {
        operator_delete(local_178._M_p);
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
      _Var3 = (_Rb_tree_color)local_258._M_dataplus._M_p;
      _Var2 = local_26c;
      uVar8 = (ulong)(_Rb_tree_color)local_258._M_dataplus._M_p;
      local_26c = local_26c - (_Rb_tree_color)local_258._M_dataplus._M_p;
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      this_00 = (SymbolEntry *)((long)&(this_00->header).entryLength + uVar8);
    } while (_Var2 != _Var3);
    if ((SymbolEntry *)
        local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (SymbolEntry *)0x0) {
      operator_delete(local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return (SymbolEntryMap *)local_260;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar6 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FetchSymbolEntries",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"(): Reading symbols failed with: 0x",0x23);
  *(uint *)(local_1b8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 0x28) =
       *(uint *)(local_1b8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 0x28) & 0xffffffb5
       | 8;
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  local_258._M_dataplus._M_p._0_4_ = CONCAT31(local_258._M_dataplus._M_p._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_258,1);
  std::__cxx11::stringbuf::str();
  Logger::Log(3,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_258._M_dataplus._M_p) !=
      &local_258.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_258._M_dataplus._M_p._4_4_,
                             (_Rb_tree_color)local_258._M_dataplus._M_p));
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  pAVar7 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(pAVar7,lVar4);
  __cxa_throw(pAVar7,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

SymbolEntryMap SymbolAccess::FetchSymbolEntries() const
{
    uint32_t bytesRead = 0;
    struct AdsSymbolUploadInfo {
        uint32_t nSymbols;
        uint32_t nSymSize;
    } uploadInfo;
    auto status = device.ReadReqEx2(ADSIGRP_SYM_UPLOADINFO,
                                    0,
                                    sizeof(uploadInfo),
                                    &uploadInfo,
                                    &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): Reading symbol info failed with: 0x" << std::hex << status << '\n');
        throw AdsException(status);
    }

    uploadInfo.nSymSize = bhf::ads::letoh(uploadInfo.nSymSize);
    std::vector<uint8_t> symbols(uploadInfo.nSymSize);
    status = device.ReadReqEx2(ADSIGRP_SYM_UPLOAD,
                               0,
                               uploadInfo.nSymSize,
                               symbols.data(),
                               &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): Reading symbols failed with: 0x" << std::hex << status << '\n');
        throw AdsException(status);
    }

    const uint8_t* data = symbols.data();
    auto nSymbols = bhf::ads::letoh(uploadInfo.nSymbols);
    auto entries = std::map<std::string, SymbolEntry> {};
    while (nSymbols--) {
        const auto next = entries.insert(bhf::ads::SymbolEntry::Parse(data, bytesRead)).first->second;
        bytesRead -= next.header.entryLength;
        data += next.header.entryLength;
        if (!bytesRead) {
            return entries;
        }
    }
    LOG_ERROR(__FUNCTION__ << "(): nSymbols: " << uploadInfo.nSymbols << " nSymSize:" << uploadInfo.nSymSize << "'\n");
    throw AdsException(ADSERR_DEVICE_INVALIDDATA);
}